

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateSource(FileGenerator *this,Printer *printer)

{
  FileDescriptor *file;
  FileOptions_OptimizeMode FVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  Options *options;
  ulong uVar5;
  NamespaceOpener ns;
  size_type __dnew;
  Formatter format;
  CrossFileReferences refs;
  string local_160;
  Options *local_140;
  undefined1 local_138 [32];
  char *local_118;
  Formatter local_110;
  CrossFileReferences local_d8;
  
  local_110.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_110.vars_._M_t,&(this->variables_)._M_t);
  GenerateSourceIncludes(this,printer);
  local_d8.weak_default_instances._M_h._M_buckets =
       &local_d8.weak_default_instances._M_h._M_single_bucket;
  options = (Options *)0x1;
  local_d8.weak_default_instances._M_h._M_bucket_count = 1;
  local_d8.weak_default_instances._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_d8.weak_default_instances._M_h._M_element_count = 0;
  local_d8.weak_default_instances._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_d8.weak_default_instances._M_h._M_rehash_policy._M_next_resize = 0;
  local_d8.weak_default_instances._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_d8.strong_reflection_files._M_h._M_buckets =
       &local_d8.strong_reflection_files._M_h._M_single_bucket;
  local_d8.strong_reflection_files._M_h._M_bucket_count = 1;
  local_d8.strong_reflection_files._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_d8.strong_reflection_files._M_h._M_element_count = 0;
  local_d8.strong_reflection_files._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_d8.strong_reflection_files._M_h._M_rehash_policy._M_next_resize = 0;
  local_d8.strong_reflection_files._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_d8.weak_reflection_files._M_h._M_buckets =
       &local_d8.weak_reflection_files._M_h._M_single_bucket;
  local_d8.weak_reflection_files._M_h._M_bucket_count = 1;
  local_d8.weak_reflection_files._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_d8.weak_reflection_files._M_h._M_element_count = 0;
  local_d8.weak_reflection_files._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_d8.weak_reflection_files._M_h._M_rehash_policy._M_next_resize = 0;
  local_d8.weak_reflection_files._M_h._M_single_bucket = (__node_base_ptr)0x0;
  GetCrossFileReferencesForFile(this,this->file_,&local_d8);
  GenerateInternalForwardDeclarations(this,&local_d8,printer);
  local_140 = &this->options_;
  Namespace_abi_cxx11_(&local_160,(cpp *)this->file_,(FileDescriptor *)local_140,options);
  NamespaceOpener::NamespaceOpener((NamespaceOpener *)local_138,&local_160,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  if ((this->message_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->message_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar5 = 0;
    do {
      GenerateSourceDefaultInstance(this,(int)uVar5,printer);
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)(this->message_generators_).
                                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->message_generators_).
                                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  NamespaceOpener::~NamespaceOpener((NamespaceOpener *)local_138);
  GenerateTables(this,printer);
  FVar1 = GetOptimizeFor(this->file_,local_140,(bool *)0x0);
  if (FVar1 != FileOptions_OptimizeMode_LITE_RUNTIME) {
    GenerateReflectionInitializationCode(this,printer);
  }
  Namespace_abi_cxx11_(&local_160,(cpp *)this->file_,(FileDescriptor *)local_140,options);
  NamespaceOpener::NamespaceOpener((NamespaceOpener *)local_138,&local_160,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  puVar2 = (this->enum_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->enum_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar2) {
    uVar5 = 0;
    do {
      EnumGenerator::GenerateMethods
                (puVar2[uVar5]._M_t.
                 super___uniq_ptr_impl<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::EnumGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>
                 .super__Head_base<0UL,_google::protobuf::compiler::cpp::EnumGenerator_*,_false>.
                 _M_head_impl,(int)uVar5,printer);
      uVar5 = uVar5 + 1;
      puVar2 = (this->enum_generators_).
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(this->enum_generators_).
                                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3));
  }
  if ((this->message_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->message_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar5 = 0;
    do {
      Formatter::operator()<>(&local_110,"\n");
      Formatter::operator()<>
                (&local_110,
                 "// ===================================================================\n");
      Formatter::operator()<>(&local_110,"\n");
      MessageGenerator::GenerateClassMethods
                ((MessageGenerator *)
                 (this->message_generators_).
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar5]._M_t.
                 super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                 ._M_t,printer);
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)(this->message_generators_).
                                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->message_generators_).
                                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  file = this->file_;
  if (0 < *(int *)(file + 0x34)) {
    FVar1 = GetOptimizeFor(file,local_140,(bool *)0x0);
    if (((FVar1 != FileOptions_OptimizeMode_LITE_RUNTIME) &&
        (*(char *)(*(long *)(file + 0x78) + 0x9b) == '\x01')) &&
       ((this->service_generators_).
        super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->service_generators_).
        super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)) {
      uVar5 = 0;
      do {
        if (uVar5 == 0) {
          Formatter::operator()<>(&local_110,"\n");
        }
        Formatter::operator()<>
                  (&local_110,
                   "// ===================================================================\n");
        Formatter::operator()<>(&local_110,"\n");
        ServiceGenerator::GenerateImplementation
                  ((ServiceGenerator *)
                   (this->service_generators_).
                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar5]._M_t.
                   super___uniq_ptr_impl<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>
                   ._M_t,printer);
        uVar5 = uVar5 + 1;
      } while (uVar5 < (ulong)((long)(this->service_generators_).
                                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->service_generators_).
                                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
  }
  puVar3 = (this->extension_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->extension_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar3) {
    uVar5 = 0;
    do {
      ExtensionGenerator::GenerateDefinition
                (puVar3[uVar5]._M_t.
                 super___uniq_ptr_impl<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>
                 .
                 super__Head_base<0UL,_google::protobuf::compiler::cpp::ExtensionGenerator_*,_false>
                 ._M_head_impl,printer);
      uVar5 = uVar5 + 1;
      puVar3 = (this->extension_generators_).
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(this->extension_generators_).
                                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3));
  }
  Formatter::operator()<>(&local_110,"\n// @@protoc_insertion_point(namespace_scope)\n");
  NamespaceOpener::~NamespaceOpener((NamespaceOpener *)local_138);
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  local_118 = (char *)0x15;
  local_160._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_160,(ulong)&local_118);
  local_160.field_2._M_allocated_capacity = (size_type)local_118;
  builtin_strncpy(local_160._M_dataplus._M_p,"PROTOBUF_NAMESPACE_ID",0x15);
  local_160._M_string_length = (size_type)local_118;
  local_160._M_dataplus._M_p[(long)local_118] = '\0';
  NamespaceOpener::NamespaceOpener((NamespaceOpener *)local_138,&local_160,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  puVar4 = (this->message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->message_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar4) {
    uVar5 = 0;
    do {
      MessageGenerator::GenerateSourceInProto2Namespace
                (puVar4[uVar5]._M_t.
                 super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                 .super__Head_base<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_false>.
                 _M_head_impl,printer);
      uVar5 = uVar5 + 1;
      puVar4 = (this->message_generators_).
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(this->message_generators_).
                                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 3));
  }
  NamespaceOpener::~NamespaceOpener((NamespaceOpener *)local_138);
  Formatter::operator()<>(&local_110,"\n// @@protoc_insertion_point(global_scope)\n");
  local_138._0_8_ = (Printer *)(local_138 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_138,"net/proto2/public/port_undef.inc","");
  DoIncludeFile(this,(string *)local_138,false,printer);
  if ((Printer *)local_138._0_8_ != (Printer *)(local_138 + 0x10)) {
    operator_delete((void *)local_138._0_8_);
  }
  std::
  _Hashtable<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_d8.weak_reflection_files._M_h);
  std::
  _Hashtable<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_d8.strong_reflection_files._M_h);
  std::
  _Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::hash<const_google::protobuf::Descriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::hash<const_google::protobuf::Descriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_d8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_110.vars_._M_t);
  return;
}

Assistant:

void FileGenerator::GenerateSource(io::Printer* printer) {
  Formatter format(printer, variables_);
  GenerateSourceIncludes(printer);
  CrossFileReferences refs;
  GetCrossFileReferencesForFile(file_, &refs);
  GenerateInternalForwardDeclarations(refs, printer);

  {
    NamespaceOpener ns(Namespace(file_, options_), format);

    // Define default instances
    for (int i = 0; i < message_generators_.size(); i++) {
      GenerateSourceDefaultInstance(i, printer);
    }
  }

  {
    GenerateTables(printer);

    if (HasDescriptorMethods(file_, options_)) {
      // Define the code to initialize reflection. This code uses a global
      // constructor to register reflection data with the runtime pre-main.
      GenerateReflectionInitializationCode(printer);
    }
  }

  {
    NamespaceOpener ns(Namespace(file_, options_), format);

    // Actually implement the protos

    // Generate enums.
    for (int i = 0; i < enum_generators_.size(); i++) {
      enum_generators_[i]->GenerateMethods(i, printer);
    }

    // Generate classes.
    for (int i = 0; i < message_generators_.size(); i++) {
      format("\n");
      format(kThickSeparator);
      format("\n");
      message_generators_[i]->GenerateClassMethods(printer);
    }

    if (HasGenericServices(file_, options_)) {
      // Generate services.
      for (int i = 0; i < service_generators_.size(); i++) {
        if (i == 0) format("\n");
        format(kThickSeparator);
        format("\n");
        service_generators_[i]->GenerateImplementation(printer);
      }
    }

    // Define extensions.
    for (int i = 0; i < extension_generators_.size(); i++) {
      extension_generators_[i]->GenerateDefinition(printer);
    }

    format(
        "\n"
        "// @@protoc_insertion_point(namespace_scope)\n");
  }

  {
    NamespaceOpener proto_ns(ProtobufNamespace(options_), format);
    for (int i = 0; i < message_generators_.size(); i++) {
      message_generators_[i]->GenerateSourceInProto2Namespace(printer);
    }
  }

  format(
      "\n"
      "// @@protoc_insertion_point(global_scope)\n");

  IncludeFile("net/proto2/public/port_undef.inc", printer);
}